

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp6.c
# Opt level: O0

void outdefines(Global *global)

{
  long in_RDI;
  DEFBUF **syp;
  DEFBUF *dp;
  DEFBUF *in_stack_00000028;
  Global *in_stack_00000030;
  undefined8 *local_18;
  Global *in_stack_fffffffffffffff0;
  undefined8 *puVar1;
  
  deldefines(in_stack_fffffffffffffff0);
  for (local_18 = (undefined8 *)(in_RDI + 0x958); local_18 < (undefined8 *)(in_RDI + 0xb58);
      local_18 = local_18 + 1) {
    for (puVar1 = (undefined8 *)*local_18; puVar1 != (undefined8 *)0x0;
        puVar1 = (undefined8 *)*puVar1) {
      outadefine(in_stack_00000030,in_stack_00000028);
    }
  }
  return;
}

Assistant:

void outdefines(struct Global *global)
{
  DEFBUF *dp;
  DEFBUF **syp;
  
  deldefines(global);                   /* Delete built-in #defines     */
  for (syp = global->symtab; syp < &global->symtab[SBSIZE]; syp++) {
    if ((dp = *syp) != (DEFBUF *) NULL) {
      do {
	outadefine(global, dp);
      } while ((dp = dp->link) != (DEFBUF *) NULL);
    }
  }
}